

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  double dVar2;
  double local_30;
  SerialProcessor<double,_boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
  local_28;
  
  local_28.
  super_ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
  .processors_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_false>
  .data_.
  super_ProcessorGroup<boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>
  .processors_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_false>
  .data_.processor_.inputs_.storage.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>,_false>
  .data_.super_ebo<boost::hana::detail::pix<1>,_chains::Constant,_false>.data_.value_ =
       (ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>
        )(Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>
          )0x3ff0000000000000;
  local_28.
  super_ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
  .processors_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_false>
  .data_.
  super_ProcessorGroup<boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>
  .processors_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>
  .
  super_ebo<boost::hana::detail::bti<1UL>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_false>
  .data_.processor_.inputs_.storage.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>,_false>
  .data_.super_ebo<boost::hana::detail::pix<1>,_chains::Constant,_false>.data_.value_ =
       (ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>
        )(Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>
          )0x4000000000000000;
  iVar1 = rand();
  local_28.
  super_ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
  .processors_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>
  .
  super_ebo<boost::hana::detail::bti<1UL>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>,_false>
  .data_.processor_.inputs_.storage.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>,_false>
  .data_.super_ebo<boost::hana::detail::pix<1>,_chains::Input,_false>.data_.value_ =
       (ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>
        )(double)(iVar1 / 0x7fffffff);
  iVar1 = rand();
  local_30 = (double)(iVar1 / 0x7fffffff);
  dVar2 = chains::
          SerialProcessor<double,_boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
          ::tick(&local_28,&local_30);
  return (int)dVar2;
}

Assistant:

int main()
{
  using namespace chains;

  const auto chain =
    serial(split(module<Gain>(Value<gain::Gain>(1)), module<Gain>(Value<gain::Gain>(2))),
           module<Crossfade, Expose<crossfade::Fade>>(Value<crossfade::Fade>(0.5)));

  auto processor = chain.makeProcessor<double>(44100);
  auto fade = boost::hana::at_c<0>(processor.exposedInputs());

  fade->setValue(rand() / RAND_MAX);

  return processor.tick(rand() / RAND_MAX);
}